

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtSphereBoxCollisionAlgorithm.cpp
# Opt level: O1

void __thiscall
cbtSphereBoxCollisionAlgorithm::processCollision
          (cbtSphereBoxCollisionAlgorithm *this,cbtCollisionObjectWrapper *body0Wrap,
          cbtCollisionObjectWrapper *body1Wrap,cbtDispatcherInfo *dispatchInfo,
          cbtManifoldResult *resultOut)

{
  float fVar1;
  float fVar2;
  cbtPersistentManifold *this_00;
  bool bVar3;
  cbtCollisionObject *pcVar4;
  cbtCollisionObject *pcVar5;
  cbtCollisionObjectWrapper *boxObjWrap;
  cbtScalar maxContactDistance;
  cbtScalar penetrationDepth;
  cbtVector3 normalOnSurfaceB;
  cbtVector3 pOnBox;
  cbtVector3 sphereCenter;
  cbtScalar local_5c;
  cbtVector3 local_58;
  cbtVector3 local_48;
  cbtVector3 local_38;
  
  if (this->m_manifoldPtr != (cbtPersistentManifold *)0x0) {
    boxObjWrap = body1Wrap;
    if (this->m_isSwapped != false) {
      boxObjWrap = body0Wrap;
      body0Wrap = body1Wrap;
    }
    local_38.m_floats._0_8_ = *(undefined8 *)(body0Wrap->m_worldTransform->m_origin).m_floats;
    local_38.m_floats._8_8_ = *(undefined8 *)((body0Wrap->m_worldTransform->m_origin).m_floats + 2);
    fVar1 = *(float *)&body0Wrap->m_shape[1].field_0xc;
    fVar2 = *(float *)&body0Wrap->m_shape->field_0x1c;
    maxContactDistance = cbtPersistentManifold::getContactBreakingThreshold(this->m_manifoldPtr);
    resultOut->m_manifoldPtr = this->m_manifoldPtr;
    bVar3 = getSphereDistance(this,boxObjWrap,&local_48,&local_58,&local_5c,&local_38,fVar1 * fVar2,
                              maxContactDistance);
    if (bVar3) {
      (*(resultOut->super_Result)._vptr_Result[4])
                ((ulong)(uint)local_5c,resultOut,&local_58,&local_48);
    }
    if (((this->m_ownManifold == true) && (this->m_manifoldPtr->m_cachedPoints != 0)) &&
       (this_00 = resultOut->m_manifoldPtr, this_00->m_cachedPoints != 0)) {
      pcVar5 = resultOut->m_body0Wrap->m_collisionObject;
      if (this_00->m_body0 == pcVar5) {
        pcVar4 = resultOut->m_body1Wrap->m_collisionObject;
      }
      else {
        pcVar4 = pcVar5;
        pcVar5 = resultOut->m_body1Wrap->m_collisionObject;
      }
      cbtPersistentManifold::refreshContactPoints
                (this_00,&pcVar5->m_worldTransform,&pcVar4->m_worldTransform);
    }
  }
  return;
}

Assistant:

void cbtSphereBoxCollisionAlgorithm::processCollision(const cbtCollisionObjectWrapper* body0Wrap, const cbtCollisionObjectWrapper* body1Wrap, const cbtDispatcherInfo& dispatchInfo, cbtManifoldResult* resultOut)
{
	(void)dispatchInfo;
	(void)resultOut;
	if (!m_manifoldPtr)
		return;

	const cbtCollisionObjectWrapper* sphereObjWrap = m_isSwapped ? body1Wrap : body0Wrap;
	const cbtCollisionObjectWrapper* boxObjWrap = m_isSwapped ? body0Wrap : body1Wrap;

	cbtVector3 pOnBox;

	cbtVector3 normalOnSurfaceB;
	cbtScalar penetrationDepth;
	cbtVector3 sphereCenter = sphereObjWrap->getWorldTransform().getOrigin();
	const cbtSphereShape* sphere0 = (const cbtSphereShape*)sphereObjWrap->getCollisionShape();
	cbtScalar radius = sphere0->getRadius();
	cbtScalar maxContactDistance = m_manifoldPtr->getContactBreakingThreshold();

	resultOut->setPersistentManifold(m_manifoldPtr);

	if (getSphereDistance(boxObjWrap, pOnBox, normalOnSurfaceB, penetrationDepth, sphereCenter, radius, maxContactDistance))
	{
		/// report a contact. internally this will be kept persistent, and contact reduction is done
		resultOut->addContactPoint(normalOnSurfaceB, pOnBox, penetrationDepth);
	}

	if (m_ownManifold)
	{
		if (m_manifoldPtr->getNumContacts())
		{
			resultOut->refreshContactPoints();
		}
	}
}